

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filtering.cpp
# Opt level: O0

void Image_Function::Median
               (Image *in,uint32_t startXIn,uint32_t startYIn,Image *out,uint32_t startXOut,
               uint32_t startYOut,uint32_t width,uint32_t height,uint32_t kernelSize)

{
  uint32_t uVar1;
  uint32_t uVar2;
  undefined8 uVar3;
  uchar *__first;
  size_type sVar4;
  uchar *puVar5;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this;
  uchar *puVar6;
  uchar *puVar7;
  uchar *puVar8;
  uchar *puVar9;
  uchar *puVar10;
  uchar *puVar11;
  int iVar12;
  ImageTemplate<unsigned_char> *in_RCX;
  int in_EDX;
  uint in_ESI;
  ImageTemplate<unsigned_char> *in_RDI;
  uint in_R8D;
  int in_R9D;
  uint in_stack_00000008;
  uint in_stack_00000010;
  uint in_stack_00000018;
  uint8_t *inXReadEnd;
  uint8_t *inXRead;
  uint8_t *inYReadEnd;
  uint8_t *inYRead;
  uint8_t *value;
  uint8_t *outXEnd;
  uint8_t *outX;
  uint8_t *inX;
  uint8_t *outYEnd;
  uint8_t *outY;
  uint8_t *inY;
  uint32_t rowSizeOut;
  uint32_t rowSizeIn;
  uint8_t *dataLastValue;
  uint8_t *medianValue;
  uint8_t *dataFirstValue;
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  uint uVar13;
  undefined4 in_stack_fffffffffffffe9c;
  uint uVar14;
  undefined4 in_stack_fffffffffffffea4;
  allocator_type *in_stack_fffffffffffffeb0;
  size_type in_stack_fffffffffffffeb8;
  undefined4 in_stack_fffffffffffffec0;
  undefined4 in_stack_fffffffffffffec4;
  uint32_t uVar15;
  char *in_stack_fffffffffffffec8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this_00;
  ImageTemplate<unsigned_char> *in_stack_fffffffffffffed0;
  uint32_t in_stack_fffffffffffffee0;
  uint32_t in_stack_fffffffffffffee8;
  undefined8 in_stack_ffffffffffffff18;
  Image *in_stack_ffffffffffffff20;
  undefined8 in_stack_ffffffffffffff28;
  Image *in_stack_ffffffffffffff30;
  uint32_t in_stack_ffffffffffffff40;
  uint32_t in_stack_ffffffffffffff48;
  uchar *local_a8;
  uchar *local_a0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_70 [3];
  int local_20;
  uint local_1c;
  ImageTemplate<unsigned_char> *local_18;
  int local_10;
  uint local_c;
  ImageTemplate<unsigned_char> *local_8;
  
  uVar13 = in_stack_00000008;
  uVar14 = in_stack_00000010;
  local_20 = in_R9D;
  local_1c = in_R8D;
  local_18 = in_RCX;
  local_10 = in_EDX;
  local_c = in_ESI;
  local_8 = in_RDI;
  ParameterValidation<PenguinV_Image::ImageTemplate<unsigned_char>>
            (in_stack_fffffffffffffed0,(uint32_t)((ulong)in_stack_fffffffffffffec8 >> 0x20),
             (uint32_t)in_stack_fffffffffffffec8,
             (ImageTemplate<unsigned_char> *)
             CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
             (uint32_t)(in_stack_fffffffffffffeb8 >> 0x20),(uint32_t)in_stack_fffffffffffffeb8,
             in_stack_fffffffffffffee0,in_stack_fffffffffffffee8);
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate
            ((ImageTemplate<unsigned_char> *)CONCAT44(in_stack_fffffffffffffea4,uVar14),
             (ImageTemplate<unsigned_char> *)CONCAT44(in_stack_fffffffffffffe9c,uVar13));
  VerifyGrayScaleImage<PenguinV_Image::ImageTemplate<unsigned_char>,PenguinV_Image::ImageTemplate<unsigned_char>>
            ((ImageTemplate<unsigned_char> *)CONCAT44(in_stack_fffffffffffffea4,uVar14),
             (ImageTemplate<unsigned_char> *)CONCAT44(in_stack_fffffffffffffe9c,uVar13));
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
            ((ImageTemplate<unsigned_char> *)0x11867c);
  if ((((2 < in_stack_00000018) && ((in_stack_00000018 & 1) != 0)) &&
      (in_stack_00000018 < in_stack_00000008)) && (in_stack_00000018 < in_stack_00000010)) {
    Copy(in_stack_ffffffffffffff30,(uint32_t)((ulong)in_stack_ffffffffffffff28 >> 0x20),
         (uint32_t)in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,
         (uint32_t)((ulong)in_stack_ffffffffffffff18 >> 0x20),(uint32_t)in_stack_ffffffffffffff18,
         in_stack_ffffffffffffff40,in_stack_ffffffffffffff48);
    Copy(in_stack_ffffffffffffff30,(uint32_t)((ulong)in_stack_ffffffffffffff28 >> 0x20),
         (uint32_t)in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,
         (uint32_t)((ulong)in_stack_ffffffffffffff18 >> 0x20),(uint32_t)in_stack_ffffffffffffff18,
         in_stack_ffffffffffffff40,in_stack_ffffffffffffff48);
    Copy(in_stack_ffffffffffffff30,(uint32_t)((ulong)in_stack_ffffffffffffff28 >> 0x20),
         (uint32_t)in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,
         (uint32_t)((ulong)in_stack_ffffffffffffff18 >> 0x20),(uint32_t)in_stack_ffffffffffffff18,
         in_stack_ffffffffffffff40,in_stack_ffffffffffffff48);
    Copy(in_stack_ffffffffffffff30,(uint32_t)((ulong)in_stack_ffffffffffffff28 >> 0x20),
         (uint32_t)in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,
         (uint32_t)((ulong)in_stack_ffffffffffffff18 >> 0x20),(uint32_t)in_stack_ffffffffffffff18,
         in_stack_ffffffffffffff40,in_stack_ffffffffffffff48);
    std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)0x1188e0);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
               in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0);
    std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x118906);
    this_00 = local_70;
    __first = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x118918);
    sVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(this_00);
    puVar5 = __first + (sVar4 >> 1);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(this_00);
    uVar1 = PenguinV_Image::ImageTemplate<unsigned_char>::rowSize(local_8);
    uVar2 = PenguinV_Image::ImageTemplate<unsigned_char>::rowSize(local_18);
    uVar15 = uVar2;
    local_a0 = PenguinV_Image::ImageTemplate<unsigned_char>::data(local_8);
    local_a0 = local_a0 + (ulong)local_c + (ulong)(local_10 * uVar1);
    this = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
           PenguinV_Image::ImageTemplate<unsigned_char>::data(local_18);
    local_a8 = (uchar *)((long)&(this->
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                                _M_impl.super__Vector_impl_data._M_start +
                        (ulong)(in_stack_00000018 >> 1) +
                        (ulong)local_1c + (ulong)((local_20 + (in_stack_00000018 >> 1)) * uVar2));
    iVar12 = in_stack_00000018 - 1;
    puVar6 = local_a8 + (in_stack_00000010 - (in_stack_00000018 - 1)) * uVar2;
    for (; local_a8 != puVar6; local_a8 = local_a8 + uVar2) {
      puVar11 = local_a0;
      for (puVar10 = local_a8; puVar10 != local_a8 + (in_stack_00000008 - iVar12);
          puVar10 = puVar10 + 1) {
        puVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                           ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x118b15);
        for (puVar9 = puVar11; puVar9 != puVar11 + in_stack_00000018 * uVar1;
            puVar9 = puVar9 + uVar1) {
          for (puVar8 = puVar9; puVar8 != puVar9 + in_stack_00000018; puVar8 = puVar8 + 1) {
            *puVar7 = *puVar8;
            puVar7 = puVar7 + 1;
          }
        }
        std::nth_element<unsigned_char*>
                  (__first,(uchar *)this_00,(uchar *)CONCAT44(uVar15,in_stack_fffffffffffffec0));
        *puVar10 = *puVar5;
        puVar11 = puVar11 + 1;
      }
      local_a0 = local_a0 + uVar1;
    }
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(this);
    return;
  }
  uVar3 = __cxa_allocate_exception(0x28);
  imageException::imageException
            ((imageException *)in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
  __cxa_throw(uVar3,&imageException::typeinfo,imageException::~imageException);
}

Assistant:

void Median( const Image & in, uint32_t startXIn, uint32_t startYIn, Image & out, uint32_t startXOut, uint32_t startYOut,
                 uint32_t width, uint32_t height, uint32_t kernelSize )
    {
        ParameterValidation( in, startXIn, startYIn, out, startXOut, startYOut, width, height );
        VerifyGrayScaleImage( in, out );

        if( kernelSize < 3 || kernelSize % 2 == 0 || kernelSize >= width || kernelSize >= height )
            throw imageException( "Kernel size for filter is not correct" );

        // Border's problem is well-known problem which can be solved in different ways
        // We just copy parts of original image without applying filtering
        Copy( in, startXIn, startYIn, out, startXOut,
              startYOut, width, kernelSize / 2 );
        Copy( in, startXIn, startYIn + height - kernelSize / 2, out, startXOut,
              startYOut + height - kernelSize / 2, width, kernelSize / 2 );
        Copy( in, startXIn, startYIn + kernelSize / 2, out, startXOut,
              startYOut + kernelSize / 2, kernelSize / 2, height - (kernelSize - 1) );
        Copy( in, startXIn + width - kernelSize / 2, startYIn + kernelSize / 2, out, startXOut + width - kernelSize / 2,
              startYOut + kernelSize / 2, kernelSize / 2, height - (kernelSize - 1) );

        std::vector < uint8_t > data( kernelSize * kernelSize );
        uint8_t * dataFirstValue = data.data();
        uint8_t * medianValue    = dataFirstValue + data.size() / 2;
        uint8_t * dataLastValue  = dataFirstValue + data.size();
        
        const uint32_t rowSizeIn  = in.rowSize();
        const uint32_t rowSizeOut = out.rowSize();

        const uint8_t * inY  = in.data()  + startYIn                     * rowSizeIn  + startXIn;
        uint8_t       * outY = out.data() + (startYOut + kernelSize / 2) * rowSizeOut + startXOut + kernelSize / 2;

        width  = width  - (kernelSize - 1);
        height = height - (kernelSize - 1);

        const uint8_t * outYEnd = outY + height * rowSizeOut;

        for( ; outY != outYEnd; outY += rowSizeOut, inY += rowSizeIn ) {
            const uint8_t * inX = inY;
            uint8_t       * outX = outY;

            const uint8_t * outXEnd = outX + width;

            for( ; outX != outXEnd; ++outX, ++inX ) {
                uint8_t * value = data.data();

                const uint8_t * inYRead    = inX;
                const uint8_t * inYReadEnd = inYRead + kernelSize * rowSizeIn;

                for( ; inYRead != inYReadEnd; inYRead += rowSizeIn ) {
                    const uint8_t * inXRead    = inYRead;
                    const uint8_t * inXReadEnd = inXRead + kernelSize;

                    for( ; inXRead != inXReadEnd; ++inXRead, ++value )
                        *value = *inXRead;
                }

                std::nth_element( dataFirstValue, medianValue, dataLastValue );
                (*outX) = *medianValue;
            }
        }
    }